

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cap.cc
# Opt level: O3

S2Cap * __thiscall S2Cap::Complement(S2Cap *__return_storage_ptr__,S2Cap *this)

{
  double dVar1;
  VType VVar2;
  VType VVar3;
  VType VVar4;
  bool bVar5;
  S2LogMessage local_20;
  
  dVar1 = (this->radius_).length2_;
  if ((dVar1 != 4.0) || (NAN(dVar1))) {
    if (0.0 <= dVar1) {
      VVar4 = (this->center_).c_[2];
      dVar1 = 4.0 - dVar1;
      if (4.0 <= dVar1) {
        dVar1 = 4.0;
      }
      VVar2 = (this->center_).c_[0];
      VVar3 = (this->center_).c_[2];
      S1ChordAngle::S1ChordAngle(&__return_storage_ptr__->radius_,dVar1);
      (__return_storage_ptr__->super_S2Region)._vptr_S2Region =
           (_func_int **)&PTR__S2Region_002bb758;
      (__return_storage_ptr__->center_).c_[0] = -VVar2;
      (__return_storage_ptr__->center_).c_[1] = -VVar3;
      (__return_storage_ptr__->center_).c_[2] = -VVar4;
      bVar5 = S2::IsUnitLength(&__return_storage_ptr__->center_);
      if ((!bVar5) || (4.0 < (__return_storage_ptr__->radius_).length2_)) {
        S2LogMessage::S2LogMessage
                  (&local_20,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.h"
                   ,0xf5,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_20.stream_,"Check failed: is_valid() ",0x19);
        goto LAB_001d3c0b;
      }
    }
    else {
      S1ChordAngle::S1ChordAngle(&__return_storage_ptr__->radius_,4.0);
      (__return_storage_ptr__->super_S2Region)._vptr_S2Region =
           (_func_int **)&PTR__S2Region_002bb758;
      (__return_storage_ptr__->center_).c_[0] = 1.0;
      (__return_storage_ptr__->center_).c_[1] = 0.0;
      (__return_storage_ptr__->center_).c_[2] = 0.0;
      bVar5 = S2::IsUnitLength(&__return_storage_ptr__->center_);
      if ((!bVar5) || (4.0 < (__return_storage_ptr__->radius_).length2_)) {
        S2LogMessage::S2LogMessage
                  (&local_20,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.h"
                   ,0xf5,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_20.stream_,"Check failed: is_valid() ",0x19);
LAB_001d3c0b:
        abort();
      }
    }
  }
  else {
    (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_002bb758;
    (__return_storage_ptr__->center_).c_[0] = 1.0;
    (__return_storage_ptr__->center_).c_[1] = 0.0;
    (__return_storage_ptr__->center_).c_[2] = 0.0;
    S1ChordAngle::S1ChordAngle(&__return_storage_ptr__->radius_,-1.0);
  }
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2Cap::Complement() const {
  // The complement of a full cap is an empty cap, not a singleton.
  // Also make sure that the complement of an empty cap is full.
  if (is_full()) return Empty();
  if (is_empty()) return Full();
  return S2Cap(-center_, S1ChordAngle::FromLength2(4 - radius_.length2()));
}